

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O0

Open_JTalk * Open_JTalk_initialize(void)

{
  Open_JTalk *open_jtalk;
  Open_JTalk *local_8;
  
  local_8 = (Open_JTalk *)malloc(0x1f8);
  if (local_8 == (Open_JTalk *)0x0) {
    local_8 = (Open_JTalk *)0x0;
  }
  else {
    Mecab_initialize((Mecab *)local_8);
    NJD_initialize(&local_8->njd);
    JPCommon_initialize(&local_8->jpcommon);
    HTS_Engine_initialize((HTS_Engine *)0x19d97a);
  }
  return local_8;
}

Assistant:

Open_JTalk *Open_JTalk_initialize()
{
	Open_JTalk *open_jtalk = (Open_JTalk *)malloc(sizeof(Open_JTalk));
	if (open_jtalk == NULL)
	{
		return NULL;
	}
	Mecab_initialize(&open_jtalk->mecab);
	NJD_initialize(&open_jtalk->njd);
	JPCommon_initialize(&open_jtalk->jpcommon);
	HTS_Engine_initialize(&open_jtalk->engine);
	return open_jtalk;
}